

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int k;
  ostream *this;
  char *word_00;
  char *text;
  longlong lVar1;
  ostream local_490 [8];
  ofstream myfile;
  string local_290 [8];
  string word;
  int local_26c;
  undefined1 local_268 [4];
  int i;
  Graph g;
  int sizeWords;
  string local_240 [8];
  string message;
  istream local_220 [8];
  ifstream infile;
  char **argv_local;
  int argc_local;
  
  if (argc == 3) {
    std::ifstream::ifstream(local_220,argv[1],8);
    std::__cxx11::string::string(local_240);
    std::operator>>(local_220,local_240);
    std::istream::operator>>(local_220,(int *)&g.inDegree);
    k = std::__cxx11::string::length();
    Graph::Graph((Graph *)local_268,k);
    for (local_26c = 0; local_26c < (int)g.inDegree; local_26c = local_26c + 1) {
      std::__cxx11::string::string(local_290);
      std::operator>>(local_220,local_290);
      word_00 = (char *)std::__cxx11::string::c_str();
      text = (char *)std::__cxx11::string::c_str();
      Graph::rk((Graph *)local_268,word_00,text,0x65);
      std::__cxx11::string::~string(local_290);
    }
    std::ofstream::ofstream(local_490);
    std::ofstream::open(local_490,argv[2],0x10);
    lVar1 = Graph::solve((Graph *)local_268);
    std::ostream::operator<<(local_490,lVar1);
    std::ofstream::close();
    argv_local._4_4_ = 0;
    std::ofstream::~ofstream(local_490);
    Graph::~Graph((Graph *)local_268);
    std::__cxx11::string::~string(local_240);
    std::ifstream::~ifstream(local_220);
  }
  else {
    this = std::operator<<((ostream *)&std::cout,
                           "Run the code with the following command: ./project5 [input_file] [output_file]"
                          );
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
    if (argc != 3) {
        cout << "Run the code with the following command: ./project5 [input_file] [output_file]" << endl;
        return 1;
    }
    ifstream infile(argv[1]);
    string message;
    infile >> message;
    int sizeWords ;
    infile >> sizeWords;
    Graph g(message.length());
    for (int i = 0; i < sizeWords; ++i) {
        string word;
        infile >> word;
        g.rk(word.c_str(),message.c_str(),101);
    }
    ofstream myfile;
    myfile.open(argv[2]);
    myfile << g.solve();
    myfile.close();
    return 0;
}